

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangw.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  __u8 _Var5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  byte bVar13;
  int iVar14;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  __u8 limit_hops;
  uint local_2b60;
  uint local_2b5c;
  undefined4 local_2b58;
  cgw_csum_xor cs_xor;
  uint dst_ifindex;
  uint src_ifindex;
  uint local_2b1c;
  uint local_2b18;
  can_filter filter;
  __u32 uid;
  canid_t local_2af8 [9];
  cgw_csum_crc8 cs_crc8;
  modattr modmsg [4];
  anon_struct_1520_3_441c1061 req;
  char crc8tab [513];
  fdmodattr fdmodmsg [4];
  uchar rxbuf [8192];
  
  limit_hops = '\0';
  cs_xor.from_idx = '\0';
  cs_xor.to_idx = '\0';
  cs_xor.result_idx = '\0';
  cs_xor.init_xor_val = '\0';
  memset(&cs_crc8,0,0x11a);
  memset(crc8tab,0,0x201);
  memset(&req,0,0x5f0);
  local_2b1c = 4;
  local_2b5c = 0;
  local_2b18 = 0;
  bVar4 = false;
  bVar3 = false;
  local_2b58 = 0;
  local_2b60 = 0;
  iVar9 = 0;
  iVar16 = 0;
  iVar14 = 0;
LAB_00101364:
  uVar7 = getopt(argc,argv,"ADFLs:d:Xteiu:l:f:c:p:x:m:M:?");
  pcVar15 = _optarg;
  switch(uVar7) {
  case 99:
    iVar8 = __isoc99_sscanf(_optarg,"%hhd:%hhd:%hhd:%hhx:%hhx:%512s",&cs_crc8,&cs_crc8.to_idx,
                            &cs_crc8.result_idx,&cs_crc8.init_crc_val,&cs_crc8.final_xor_val,crc8tab
                           );
    if ((iVar8 == 6) && (sVar11 = strlen(crc8tab), sVar11 == 0x200)) {
      iVar8 = b64hex(crc8tab,cs_crc8.crctab,0x100);
      bVar3 = true;
      if (iVar8 == 0) goto LAB_00101364;
    }
    pcVar15 = "Bad CRC8 checksum definition \'%s\'.\n";
    break;
  case 100:
    local_2b5c = if_nametoindex(_optarg);
    if (local_2b5c == 0) {
      pcVar15 = "dst if_nametoindex";
      goto LAB_001022f3;
    }
    goto LAB_00101364;
  case 0x65:
    local_2b60 = local_2b60 | 1;
    goto LAB_00101364;
  case 0x66:
    iVar8 = __isoc99_sscanf(_optarg,"%x:%x",&filter,&filter.can_mask);
    local_2b58 = 1;
    if (iVar8 == 2) goto LAB_00101364;
    iVar8 = __isoc99_sscanf(_optarg,"%x~%x",&filter,&filter.can_mask);
    if (iVar8 == 2) {
      filter.can_id._3_1_ = filter.can_id._3_1_ | 0x20;
      local_2b58 = 1;
      goto LAB_00101364;
    }
    pcVar15 = "Bad filter definition \'%s\'.\n";
    break;
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x76:
  case 0x77:
switchD_00101391_caseD_67:
    fprintf(_stderr,"Unknown option %c\n",(ulong)uVar7);
    goto LAB_0010229e;
  case 0x69:
    local_2b60 = local_2b60 | 4;
    goto LAB_00101364;
  case 0x6c:
    iVar8 = __isoc99_sscanf(_optarg,"%hhu",&limit_hops);
    if ((iVar8 == 1) && (limit_hops != '\0')) goto LAB_00101364;
    pcVar15 = "Bad hop limit definition \'%s\'.\n";
    break;
  case 0x6d:
    if (iVar9 < 4) {
      rxbuf[0] = '\0';
      rxbuf[1] = '\0';
      rxbuf[2] = '\0';
      rxbuf[3] = '\0';
      rxbuf[4] = '\0';
      rxbuf[5] = '\0';
      rxbuf[6] = '\0';
      rxbuf[7] = '\0';
      rxbuf[8] = '\0';
      rxbuf[9] = '\0';
      rxbuf[10] = '\0';
      rxbuf[0xb] = '\0';
      rxbuf[0xc] = '\0';
      rxbuf[0xd] = '\0';
      rxbuf[0xe] = '\0';
      rxbuf[0xf] = '\0';
      rxbuf[0x10] = '\0';
      pcVar10 = strchr(_optarg,0x3a);
      if ((pcVar10 == pcVar15) || (3 < (long)pcVar10 - (long)pcVar15)) {
        local_2b1c = 1;
        pcVar15 = _optarg;
      }
      else {
        cVar2 = *pcVar15;
        if (cVar2 == 'X') {
          if (pcVar15[1] != 'O') goto LAB_001022cc;
          _Var5 = '\x03';
          cVar2 = pcVar15[2];
joined_r0x00101822:
          if (cVar2 == 'R') {
LAB_00101835:
            modmsg[iVar9].instruction = _Var5;
            pcVar1 = pcVar10 + 1;
            pcVar12 = strchr(pcVar1,0x3a);
            if ((pcVar12 != pcVar1) && ((long)pcVar12 - (long)pcVar1 < 4)) {
              modmsg[iVar9].modtype = '\0';
              pcVar10 = pcVar10 + 2;
              bVar6 = 0;
              do {
                cVar2 = pcVar10[-1];
                if (cVar2 == 'D') {
                  bVar13 = 4;
                }
                else {
                  bVar13 = 1;
                  if (cVar2 != 'I') {
                    if (cVar2 != 'L') goto LAB_001018a2;
                    bVar13 = 2;
                  }
                }
                bVar6 = bVar6 | bVar13;
                modmsg[iVar9].modtype = bVar6;
                pcVar10 = pcVar10 + 1;
              } while( true );
            }
            local_2b1c = 3;
            pcVar15 = _optarg;
            goto LAB_00102358;
          }
        }
        else {
          if (cVar2 == 'O') {
            _Var5 = '\x02';
            cVar2 = pcVar15[1];
            goto joined_r0x00101822;
          }
          if (cVar2 == 'S') {
            if ((pcVar15[1] != 'E') || (_Var5 = '\x04', pcVar15[2] != 'T')) goto LAB_001022cc;
            goto LAB_00101835;
          }
          if (((cVar2 == 'A') && (pcVar15[1] == 'N')) && (_Var5 = '\x01', pcVar15[2] == 'D'))
          goto LAB_00101835;
        }
LAB_001022cc:
        local_2b1c = 2;
        pcVar15 = _optarg;
      }
      goto LAB_00102358;
    }
    goto LAB_00101364;
  case 0x70:
    iVar8 = __isoc99_sscanf(_optarg,"%hhu:",&cs_crc8.profile);
    if (iVar8 == 1) {
      if (cs_crc8.profile == '\x03') goto LAB_00101364;
      if (cs_crc8.profile == '\x02') {
        pcVar15 = strchr(pcVar15,0x3a);
        if ((pcVar15 != (char *)0x0) && (sVar11 = strlen(pcVar15), sVar11 == 0x21)) {
          uVar7 = b64hex(pcVar15 + 1,cs_crc8.profile_data,0x10);
          goto LAB_001017ee;
        }
      }
      else if (cs_crc8.profile == '\x01') {
        iVar8 = __isoc99_sscanf(pcVar15,"%hhu:%2hhx",&cs_crc8.profile,cs_crc8.profile_data);
        uVar7 = (uint)(iVar8 != 2);
LAB_001017ee:
        if (uVar7 == 0) goto LAB_00101364;
      }
    }
    pcVar15 = "Bad CRC8 profile definition \'%s\'.\n";
    break;
  case 0x73:
    local_2b18 = if_nametoindex(_optarg);
    if (local_2b18 == 0) {
      pcVar15 = "src if_nametoindex";
LAB_001022f3:
      perror(pcVar15);
      goto LAB_0010236d;
    }
    goto LAB_00101364;
  case 0x74:
    local_2b60 = local_2b60 | 2;
    goto LAB_00101364;
  case 0x75:
    strtoul(_optarg,(char **)0x0,0x10);
    goto LAB_00101364;
  case 0x78:
    iVar8 = __isoc99_sscanf(_optarg,"%hhd:%hhd:%hhd:%hhx",&cs_xor,&cs_xor.to_idx,&cs_xor.result_idx,
                            &cs_xor.init_xor_val);
    bVar4 = true;
    if (iVar8 == 4) goto LAB_00101364;
    pcVar15 = "Bad XOR checksum definition \'%s\'.\n";
    break;
  default:
    switch(uVar7) {
    case 0x3f:
      pcVar15 = __xpg_basename(*argv);
      print_usage(pcVar15);
      exit(0);
    case 0x40:
    case 0x42:
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
      goto switchD_00101391_caseD_67;
    case 0x41:
      iVar16 = iVar16 + (uint)(iVar16 == 0);
      break;
    case 0x44:
      if (iVar16 == 0) {
        iVar16 = 2;
      }
      break;
    case 0x46:
      if (iVar16 == 0) {
        iVar16 = 3;
      }
      break;
    case 0x4c:
      if (iVar16 == 0) {
        iVar16 = 4;
      }
      break;
    case 0x4d:
      if (iVar14 < 4) {
        memset(rxbuf,0,0x81);
        pcVar10 = strchr(pcVar15,0x3a);
        if ((pcVar10 == pcVar15) || (3 < (long)pcVar10 - (long)pcVar15)) {
          uVar17 = 1;
          pcVar15 = _optarg;
        }
        else {
          cVar2 = *pcVar15;
          if (cVar2 == 'X') {
            if (pcVar15[1] != 'O') goto LAB_0010230d;
            _Var5 = '\x11';
            cVar2 = pcVar15[2];
joined_r0x00101954:
            if (cVar2 == 'R') {
LAB_0010195a:
              fdmodmsg[iVar14].instruction = _Var5;
              pcVar1 = pcVar10 + 1;
              pcVar12 = strchr(pcVar1,0x3a);
              if ((pcVar12 != pcVar1) && ((long)pcVar12 - (long)pcVar1 < 5)) {
                fdmodmsg[iVar14].modtype = '\0';
                pcVar10 = pcVar10 + 2;
                bVar6 = 0;
                do {
                  switch(pcVar10[-1]) {
                  case 'D':
                    bVar13 = 4;
                    break;
                  case 'E':
                  case 'G':
                  case 'H':
                  case 'J':
                  case 'K':
                    goto switchD_001019b4_caseD_45;
                  case 'F':
                    bVar13 = 8;
                    break;
                  case 'I':
                    bVar13 = 1;
                    break;
                  case 'L':
                    bVar13 = 2;
                    break;
                  default:
                    goto switchD_001019b4_default;
                  }
                  bVar6 = bVar6 | bVar13;
                  fdmodmsg[iVar14].modtype = bVar6;
                  pcVar10 = pcVar10 + 1;
                } while( true );
              }
              uVar17 = 3;
              pcVar15 = _optarg;
              goto LAB_00102363;
            }
          }
          else {
            if (cVar2 == 'O') {
              _Var5 = '\x10';
              cVar2 = pcVar15[1];
              goto joined_r0x00101954;
            }
            if (cVar2 != 'S') {
              if ((cVar2 != 'A') || ((pcVar15[1] != 'N' || (_Var5 = '\x0f', pcVar15[2] != 'D'))))
              goto LAB_0010230d;
              goto LAB_0010195a;
            }
            if ((pcVar15[1] == 'E') && (_Var5 = '\x12', pcVar15[2] == 'T')) goto LAB_0010195a;
          }
LAB_0010230d:
          uVar17 = 2;
          pcVar15 = _optarg;
        }
        goto LAB_00102363;
      }
      break;
    default:
      if (uVar7 != 0x58) {
        if (uVar7 != 0xffffffff) goto switchD_00101391_caseD_67;
        if (((_optind == argc) && (iVar16 != 0)) &&
           ((1 < iVar16 - 1U || ((local_2b18 != 0 && (local_2b5c != 0)))))) {
          if ((local_2b60 & 8) == 0) {
            if (iVar14 == 0) {
LAB_00101abc:
              if ((iVar9 != 0 || iVar14 != 0) || (!bVar3 && !bVar4)) {
                local_2b5c = socket(0x10,3,0);
                iVar9 = (*(code *)(&DAT_001030d8 +
                                  *(int *)(&DAT_001030d8 + (ulong)(iVar16 - 1U) * 4)))();
                return iVar9;
              }
              pcVar15 = "-c or -x can only be used in conjunction with -m/-M";
            }
            else {
              pcVar15 = "No -M modifications allowed in Classic CAN mode!";
            }
          }
          else {
            if (iVar9 == 0) goto LAB_00101abc;
            pcVar15 = "No -m modifications allowed in CAN FD mode!";
          }
          puts(pcVar15);
        }
        else {
LAB_0010229e:
          pcVar15 = __xpg_basename(*argv);
          print_usage(pcVar15);
        }
        goto LAB_0010236d;
      }
      local_2b60 = local_2b60 | 8;
    }
    goto LAB_00101364;
  }
  printf(pcVar15,_optarg);
  goto LAB_0010236d;
switchD_001019b4_default:
  if (pcVar10[-1] != ':') {
switchD_001019b4_caseD_45:
    uVar17 = 4;
    goto LAB_00102363;
  }
  iVar8 = __isoc99_sscanf(pcVar10,"%x.%hhx.%hhx.%128s",local_2af8,&fdmodmsg[iVar14].cf.flags,
                          &fdmodmsg[iVar14].cf.len,rxbuf);
  if (iVar8 != 4) {
    uVar17 = 5;
    pcVar15 = _optarg;
    goto LAB_00102363;
  }
  fdmodmsg[iVar14].cf.can_id = local_2af8[0];
  sVar11 = strlen((char *)rxbuf);
  if (sVar11 != 0x80) {
    uVar17 = 6;
    pcVar15 = _optarg;
    goto LAB_00102363;
  }
  iVar8 = b64hex((char *)rxbuf,fdmodmsg[iVar14].cf.data,0x40);
  iVar14 = iVar14 + 1;
  if (iVar8 != 0) {
    uVar17 = 7;
    pcVar15 = _optarg;
LAB_00102363:
    printf("Problem %d with modification definition \'%s\'.\n",uVar17,pcVar15);
LAB_0010236d:
    exit(1);
  }
  goto LAB_00101364;
LAB_001018a2:
  if (cVar2 == ':') {
    iVar8 = __isoc99_sscanf(pcVar10,"%x.%hhx.%16s",local_2af8,&modmsg[iVar9].cf.field_1,rxbuf);
    if (iVar8 == 3) {
      modmsg[iVar9].cf.can_id = local_2af8[0];
      sVar11 = strlen((char *)rxbuf);
      if (sVar11 == 0x10) {
        iVar8 = b64hex((char *)rxbuf,modmsg[iVar9].cf.data,8);
        iVar9 = iVar9 + 1;
        if (iVar8 == 0) goto LAB_00101364;
        local_2b1c = 7;
        pcVar15 = _optarg;
      }
      else {
        local_2b1c = 6;
        pcVar15 = _optarg;
      }
    }
    else {
      local_2b1c = 5;
      pcVar15 = _optarg;
    }
  }
LAB_00102358:
  uVar17 = (ulong)local_2b1c;
  goto LAB_00102363;
}

Assistant:

int main(int argc, char **argv)
{
	int s;
	int err = 0;

	int opt;
	extern int optind, opterr, optopt;

	int cmd = UNSPEC;
	int have_filter = 0;
	int have_cs_xor = 0;
	int have_cs_crc8 = 0;

	struct {
		struct nlmsghdr nh;
		struct rtcanmsg rtcan;
		char buf[1500];
	} req;

	unsigned char rxbuf[8192]; /* netlink receive buffer */
	struct nlmsghdr *nlh;
	struct nlmsgerr *rte;
	unsigned int src_ifindex = 0;
	unsigned int dst_ifindex = 0;
	__u32 uid = 0;
	__u8 limit_hops = 0;
	__u16 flags = 0;
	int len;

	struct can_filter filter;
	struct sockaddr_nl nladdr;

	struct cgw_csum_xor cs_xor = { 0 };
	struct cgw_csum_crc8 cs_crc8 = { 0 };
	char crc8tab[513] = {0};

	struct modattr modmsg[CGW_MOD_FUNCS];
	struct fdmodattr fdmodmsg[CGW_MOD_FUNCS];
	int modidx = 0;
	int fdmodidx = 0;
	int i;

	memset(&req, 0, sizeof(req));

	while ((opt = getopt(argc, argv, "ADFLs:d:Xteiu:l:f:c:p:x:m:M:?")) != -1) {
		switch (opt) {

		case 'A':
			if (cmd == UNSPEC)
				cmd = ADD;
			break;

		case 'D':
			if (cmd == UNSPEC)
				cmd = DEL;
			break;

		case 'F':
			if (cmd == UNSPEC)
				cmd = FLUSH;
			break;

		case 'L':
			if (cmd == UNSPEC)
				cmd = LIST;
			break;

		case 's':
			src_ifindex = if_nametoindex(optarg);
			if (!src_ifindex) {
				perror("src if_nametoindex");
				exit(1);
			}
			break;

		case 'd':
			dst_ifindex = if_nametoindex(optarg);
			if (!dst_ifindex) {
				perror("dst if_nametoindex");
				exit(1);
			}
			break;

		case 'X':
			flags |= CGW_FLAGS_CAN_FD;
			break;

		case 't':
			flags |= CGW_FLAGS_CAN_SRC_TSTAMP;
			break;

		case 'e':
			flags |= CGW_FLAGS_CAN_ECHO;
			break;

		case 'i':
			flags |= CGW_FLAGS_CAN_IIF_TX_OK;
			break;

		case 'u':
			uid = strtoul(optarg, NULL, 16);
			break;

		case 'l':
			if (sscanf(optarg, "%hhu", &limit_hops) != 1 || !(limit_hops)) {
				printf("Bad hop limit definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'f':
			if (sscanf(optarg, "%x:%x", &filter.can_id,
				   &filter.can_mask) == 2) {
				have_filter = 1;
			} else if (sscanf(optarg, "%x~%x", &filter.can_id,
					  &filter.can_mask) == 2) {
				filter.can_id |= CAN_INV_FILTER;
				have_filter = 1;
			} else {
				printf("Bad filter definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'x':
			if (sscanf(optarg, "%hhd:%hhd:%hhd:%hhx",
				   &cs_xor.from_idx, &cs_xor.to_idx,
				   &cs_xor.result_idx, &cs_xor.init_xor_val) == 4) {
				have_cs_xor = 1;
			} else {
				printf("Bad XOR checksum definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'c':
			if ((sscanf(optarg, "%hhd:%hhd:%hhd:%hhx:%hhx:%512s",
				    &cs_crc8.from_idx, &cs_crc8.to_idx,
				    &cs_crc8.result_idx, &cs_crc8.init_crc_val,
				    &cs_crc8.final_xor_val, crc8tab) == 6) &&
			    (strlen(crc8tab) == 512) &&
			    (b64hex(crc8tab, (unsigned char *)&cs_crc8.crctab, 256) == 0)) {
				have_cs_crc8 = 1;
			} else {
				printf("Bad CRC8 checksum definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'p':
			if (parse_crc8_profile(optarg, &cs_crc8)) {
				printf("Bad CRC8 profile definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'm':
			/* may be triggered by each of the CGW_MOD_FUNCS functions */
			if ((modidx < CGW_MOD_FUNCS) && (err = parse_mod(optarg, &modmsg[modidx++]))) {
				printf("Problem %d with modification definition '%s'.\n", err, optarg);
				exit(1);
			}
			break;

		case 'M':
			/* may be triggered by each of the CGW_FDMOD_FUNCS functions */
			if ((fdmodidx < CGW_MOD_FUNCS) && (err = parse_fdmod(optarg, &fdmodmsg[fdmodidx++]))) {
				printf("Problem %d with modification definition '%s'.\n", err, optarg);
				exit(1);
			}
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind != 0) || (cmd == UNSPEC)) {
		print_usage(basename(argv[0]));
		exit(1);
	}

	if ((cmd == ADD || cmd == DEL) &&
	    ((!src_ifindex) || (!dst_ifindex))) {
		print_usage(basename(argv[0]));
		exit(1);
	}

	if (flags & CGW_FLAGS_CAN_FD) {
		if (modidx) {
			printf("No -m modifications allowed in CAN FD mode!\n");
			exit(1);
		}
	} else {
		if (fdmodidx) {
			printf("No -M modifications allowed in Classic CAN mode!\n");
			exit(1);
		}
	}

	if ((!modidx && !fdmodidx) && (have_cs_crc8 || have_cs_xor)) {
		printf("-c or -x can only be used in conjunction with -m/-M\n");
		exit(1);
	}

	s = socket(PF_NETLINK, SOCK_RAW, NETLINK_ROUTE);

	switch (cmd) {

	case ADD:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_NEWROUTE;
		break;

	case DEL:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_DELROUTE;
		break;

	case FLUSH:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_DELROUTE;
		/* if_index set to 0 => remove all entries */
		src_ifindex  = 0;
		dst_ifindex  = 0;
		break;

	case LIST:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_DUMP;
		req.nh.nlmsg_type  = RTM_GETROUTE;
		break;

	default:
		printf("This function is not yet implemented.\n");
		exit(1);
		break;
	}

	req.nh.nlmsg_len   = NLMSG_LENGTH(sizeof(struct rtcanmsg));
	req.nh.nlmsg_seq   = 0;

	req.rtcan.can_family  = AF_CAN;
	req.rtcan.gwtype = CGW_TYPE_CAN_CAN;
	req.rtcan.flags = flags;

	addattr_l(&req.nh, sizeof(req), CGW_SRC_IF, &src_ifindex, sizeof(src_ifindex));
	addattr_l(&req.nh, sizeof(req), CGW_DST_IF, &dst_ifindex, sizeof(dst_ifindex));

	/* add new attributes here */

	if (have_filter)
		addattr_l(&req.nh, sizeof(req), CGW_FILTER, &filter, sizeof(filter));

	if (have_cs_crc8)
		addattr_l(&req.nh, sizeof(req), CGW_CS_CRC8, &cs_crc8, sizeof(cs_crc8));

	if (have_cs_xor)
		addattr_l(&req.nh, sizeof(req), CGW_CS_XOR, &cs_xor, sizeof(cs_xor));

	if (uid)
		addattr_l(&req.nh, sizeof(req), CGW_MOD_UID, &uid, sizeof(__u32));

	if (limit_hops)
		addattr_l(&req.nh, sizeof(req), CGW_LIM_HOPS, &limit_hops, sizeof(__u8));

	/*
	 * a better example code
	 * modmsg.modtype = CGW_MOD_ID;
	 * addattr_l(&req.n, sizeof(req), CGW_MOD_SET, &modmsg, CGW_MODATTR_LEN);
	 */

	/* add up to CGW_MOD_FUNCS modification definitions */
	for (i = 0; i < modidx; i++)
		addattr_l(&req.nh, sizeof(req), modmsg[i].instruction, &modmsg[i], CGW_MODATTR_LEN);

	/* add up to CGW_FDMOD_FUNCS modification definitions */
	for (i = 0; i < fdmodidx; i++)
		addattr_l(&req.nh, sizeof(req), fdmodmsg[i].instruction, &fdmodmsg[i], CGW_FDMODATTR_LEN);

	memset(&nladdr, 0, sizeof(nladdr));
	nladdr.nl_family = AF_NETLINK;
	nladdr.nl_pid    = 0;
	nladdr.nl_groups = 0;

	err = sendto(s, &req, req.nh.nlmsg_len, 0,
		     (struct sockaddr*)&nladdr, sizeof(nladdr));
	if (err < 0) {
		perror("netlink sendto");
		return err;
	}

	/* clean netlink receive buffer */
	memset(rxbuf, 0x0, sizeof(rxbuf));

	if (cmd != LIST) {

		/*
		 * cmd == ADD || cmd == DEL || cmd == FLUSH
		 *
		 * Parse the requested netlink acknowledge return values.
		 */

		err = recv(s, &rxbuf, sizeof(rxbuf), 0);
		if (err < 0) {
			perror("netlink recv");
			return err;
		}
		nlh = (struct nlmsghdr *)rxbuf;
		if (nlh->nlmsg_type != NLMSG_ERROR) {
			fprintf(stderr, "unexpected netlink answer of type %d\n", nlh->nlmsg_type);
			return -EINVAL;
		}
		rte = (struct nlmsgerr *)NLMSG_DATA(nlh);
		err = rte->error;
		if (err < 0)
			fprintf(stderr, "netlink error %d (%s)\n", err, strerror(abs(err)));

	} else {

		/* cmd == LIST */

		while (1) {
			len = recv(s, &rxbuf, sizeof(rxbuf), 0);
			if (len < 0) {
				perror("netlink recv");
				return len;
			}
#if 0
			printf("received msg len %d\n", len);

			for (i = 0; i < len; i++)
				printf("%02X ", rxbuf[i]);

			printf("\n");
#endif
			/* leave on errors or NLMSG_DONE */
			if (parse_rtlist(argv[0], rxbuf, len))
				break;
		}
	}

	close(s);

	return err;
}